

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimSnapshotManager.cpp
# Opt level: O0

Snapshot * __thiscall OpenMD::SimSnapshotManager::getSnapshot(SimSnapshotManager *this,int id)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  
  if ((*(long *)(in_RDI + 0x18) != 0) &&
     (iVar1 = Snapshot::getID(*(Snapshot **)(in_RDI + 0x18)), iVar1 == in_ESI)) {
    return *(Snapshot **)(in_RDI + 0x18);
  }
  if ((*(long *)(in_RDI + 0x20) != 0) &&
     (iVar1 = Snapshot::getID(*(Snapshot **)(in_RDI + 0x20)), iVar1 == in_ESI)) {
    return *(Snapshot **)(in_RDI + 0x20);
  }
  return (Snapshot *)0x0;
}

Assistant:

Snapshot* SimSnapshotManager::getSnapshot(int id) {
    if (currentSnapshot_ != NULL && currentSnapshot_->getID() == id) {
      return currentSnapshot_;
    } else if (previousSnapshot_ != NULL && previousSnapshot_->getID() == id) {
      return previousSnapshot_;
    } else {
      return NULL;
    }
  }